

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tidy.c
# Opt level: O2

void printOption(TidyDoc tdoc,TidyOption topt,OptionDesc *d)

{
  int iVar1;
  TidyConfigCategory TVar2;
  ctmbstr ptVar3;
  size_t sVar4;
  char *s;
  TidyOption __src;
  char *sbuf;
  char *sbuf_00;
  char *sbuf_01;
  char *s_00;
  ctmbstr __s2;
  bool bVar5;
  char *pcVar6;
  char *pcVar7;
  char *pcVar8;
  int iVar9;
  undefined8 *__size;
  char *pc1;
  char *pc2;
  char *pc3;
  char *local_40;
  TidyIterator local_38;
  
  __src = topt;
  TVar2 = tidyOptGetCategory(topt);
  if (TVar2 == TidyInternalCategory) {
    return;
  }
  s_00 = d->name;
  if ((*s_00 == '\0') && (*d->type == '\0')) {
    return;
  }
  if (d->haveVals == no) {
    s = "-";
LAB_00132783:
    local_40 = (char *)0x0;
  }
  else {
    s = d->vals;
    if (s != (char *)0x0) goto LAB_00132783;
    local_38 = tidyOptGetPickList(topt);
    iVar9 = 0;
    bVar5 = false;
    while (local_38 != (TidyIterator)0x0) {
      iVar1 = iVar9 + 2;
      if (!bVar5) {
        iVar1 = iVar9;
      }
      __src = (TidyOption)&local_38;
      ptVar3 = tidyOptGetNextPick(topt,&local_38);
      sVar4 = strlen(ptVar3);
      iVar9 = (int)sVar4 + iVar1;
      bVar5 = true;
    }
    __size = (undefined8 *)(ulong)(iVar9 + 1);
    s = (char *)malloc((size_t)__size);
    if (s == (char *)0x0) goto LAB_001328e4;
    *s = '\0';
    local_38 = tidyOptGetPickList(topt);
    bVar5 = false;
    while (local_38 != (TidyIterator)0x0) {
      if (bVar5) {
        sVar4 = strlen(s);
        (s + sVar4)[0] = ',';
        (s + sVar4)[1] = ' ';
        s[sVar4 + 2] = '\0';
      }
      __src = (TidyOption)tidyOptGetNextPick(topt,&local_38);
      strcat(s,(char *)__src);
      bVar5 = true;
    }
    s_00 = d->name;
    local_40 = s;
  }
  ptVar3 = d->type;
  sbuf = (char *)malloc(0x1c);
  sbuf_00 = (char *)malloc(10);
  __size = (undefined8 *)0x29;
  sbuf_01 = (char *)malloc(0x29);
  if (((sbuf != (char *)0x0) && (sbuf_00 != (char *)0x0)) && (sbuf_01 != (char *)0x0)) {
    do {
      s_00 = cutToWhiteSpace(s_00,0x1b,sbuf);
      ptVar3 = cutToWhiteSpace(ptVar3,9,sbuf_00);
      s = cutToWhiteSpace(s,0x28,sbuf_01);
      pcVar8 = sbuf;
      if (*sbuf == '\0') {
        pcVar8 = "";
      }
      pcVar7 = sbuf_00;
      if (*sbuf_00 == '\0') {
        pcVar7 = "";
      }
      pcVar6 = sbuf_01;
      if (*sbuf_01 == '\0') {
        pcVar6 = "";
      }
      printf("%-27.27s %-9.9s  %-40.40s\n",pcVar8,pcVar7,pcVar6);
    } while (((s_00 != (char *)0x0) || (ptVar3 != (char *)0x0)) || (s != (char *)0x0));
    free(sbuf);
    free(sbuf_00);
    free(sbuf_01);
    free(local_40);
    return;
  }
LAB_001328e4:
  outOfMemory();
  ptVar3 = tidyOptGetName((TidyOption)*__size);
  __s2 = tidyOptGetName(*(TidyOption *)__src);
  strcmp(ptVar3,__s2);
  return;
}

Assistant:

static void printOption(TidyDoc ARG_UNUSED(tdoc), /**< The Tidy document. */
                        TidyOption topt,          /**< The option to print. */
                        OptionDesc *d             /**< A pointer to the OptionDesc array. */
                        )
{
    if (tidyOptGetCategory( topt ) == TidyInternalCategory )
        return;

    if ( *d->name || *d->type )
    {
        ctmbstr pval = d->vals;
        tmbstr val = NULL;
        if (!d->haveVals)
        {
            pval = "-";
        }
        else if (pval == NULL)
        {
            val = GetAllowedValues( topt, d);
            pval = val;
        }
        print3Columns( fmt, 27, 9, 40, d->name, d->type, pval );
        if (val)
            free(val);
    }
}